

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

string * __thiscall
wabt::operator+[abi_cxx11_(string *__return_storage_ptr__,wabt *this,string_view x,string_view y)

{
  const_pointer pcVar1;
  undefined1 local_30 [8];
  string_view y_local;
  string_view x_local;
  string *s;
  
  local_30 = (undefined1  [8])x.size_;
  y_local.data_ = y.data_;
  y_local.size_ = (size_type)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  string_view::size((string_view *)&y_local.size_);
  string_view::size((string_view *)local_30);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = string_view::data((string_view *)&y_local.size_);
  string_view::size((string_view *)&y_local.size_);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar1);
  pcVar1 = string_view::data((string_view *)local_30);
  string_view::size((string_view *)local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator+(string_view x, string_view y) {
  std::string s;
  s.reserve(x.size() + y.size());
  s.append(x.data(), x.size());
  s.append(y.data(), y.size());
  return s;
}